

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,int *value)

{
  bool bVar1;
  int iVar2;
  uint64_t pos;
  ostream *poVar3;
  value_type_conflict2 *pvVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  allocator local_629;
  string local_628;
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8;
  string local_5a8 [32];
  string local_588 [32];
  string local_568;
  string local_548 [32];
  string local_528 [32];
  string local_508;
  string local_4e8;
  int local_4c4;
  int local_4c0;
  int err;
  int int_value;
  byte local_491;
  string local_490 [32];
  string local_470 [39];
  allocator local_449;
  string local_448;
  byte local_421;
  string local_420 [39];
  char local_3f9;
  undefined1 local_3f8 [7];
  char c;
  string local_3d8 [32];
  string local_3b8;
  char local_396;
  byte local_395;
  int local_394;
  undefined1 local_390 [2];
  char sc;
  bool has_sign;
  ostringstream local_370 [8];
  ostringstream ss_e;
  undefined1 local_1f8 [8];
  expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  flt;
  string fp_str;
  uint64_t loc;
  stringstream ss;
  ostream aoStack_198 [376];
  int *local_20;
  int *value_local;
  AsciiParser *this_local;
  
  local_20 = value;
  value_local = (int *)this;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&loc);
  pos = CurrLoc(this);
  ::std::__cxx11::string::string
            ((string *)
             &flt.contained.
              super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value);
  bVar1 = LexFloat(this,(string *)
                        &flt.contained.
                         super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
  if (bVar1) {
    anon_unknown_3::ParseDouble
              ((expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1f8,
               (string *)
               &flt.contained.
                super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value);
    bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_1f8);
    if (bVar1) {
      pvVar4 = nonstd::expected_lite::
               expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1f8);
      *local_20 = (int)*pvVar4;
      this_local._7_1_ = 1;
      local_394 = 1;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_370);
      poVar3 = ::std::operator<<((ostream *)local_370,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadBasicType");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x326);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_370,"Failed to parse floating value.");
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)local_390);
      ::std::__cxx11::string::~string((string *)local_390);
      this_local._7_1_ = 0;
      local_394 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_370);
    }
    nonstd::expected_lite::
    expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~expected((expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1f8);
    if (local_394 != 0) goto LAB_0053bcc2;
  }
  SeekTo(this,pos);
  local_395 = 0;
  bVar1 = Char1(this,&local_396);
  if (bVar1) {
    (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
    if (local_396 == '+') {
      local_395 = 1;
    }
    else if (local_396 == '-') {
      local_395 = 1;
    }
    else if ((local_396 < '0') || ('9' < local_396)) {
      ::std::__cxx11::to_string((string *)local_3f8,(int)local_396);
      ::std::operator+((char *)local_3d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Sign or 0-9 expected, but got \'");
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_3b8,(char *)local_3d8);
      PushError(this,&local_3b8);
      ::std::__cxx11::string::~string((string *)&local_3b8);
      ::std::__cxx11::string::~string(local_3d8);
      ::std::__cxx11::string::~string((string *)local_3f8);
      this_local._7_1_ = 0;
      local_394 = 1;
      goto LAB_0053bcc2;
    }
    ::std::operator<<(aoStack_198,local_396);
    while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = Char1(this,&local_3f9);
      if (!bVar1) {
        this_local._7_1_ = 0;
        local_394 = 1;
        goto LAB_0053bcc2;
      }
      if ((local_3f9 < '0') || ('9' < local_3f9)) {
        StreamReader::seek_from_current(this->_sr,-1);
        break;
      }
      ::std::operator<<(aoStack_198,local_3f9);
    }
    local_421 = 0;
    bVar1 = false;
    if ((local_395 & 1) != 0) {
      ::std::__cxx11::stringstream::str();
      local_421 = 1;
      lVar5 = ::std::__cxx11::string::size();
      bVar1 = lVar5 == 1;
    }
    if ((local_421 & 1) != 0) {
      ::std::__cxx11::string::~string(local_420);
    }
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_448,"Integer value expected but got sign character only.\n",
                 &local_449);
      PushError(this,&local_448);
      ::std::__cxx11::string::~string((string *)&local_448);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_449);
      this_local._7_1_ = 0;
      local_394 = 1;
    }
    else {
      ::std::__cxx11::stringstream::str();
      uVar6 = ::std::__cxx11::string::size();
      local_491 = 0;
      bVar1 = false;
      if (1 < uVar6) {
        ::std::__cxx11::stringstream::str();
        local_491 = 1;
        pcVar7 = (char *)::std::__cxx11::string::operator[]((ulong)local_490);
        bVar1 = *pcVar7 == '0';
      }
      if ((local_491 & 1) != 0) {
        ::std::__cxx11::string::~string(local_490);
      }
      ::std::__cxx11::string::~string(local_470);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&int_value,"Zero padded integer value is not allowed.\n",
                   (allocator *)((long)&err + 3));
        PushError(this,(string *)&int_value);
        ::std::__cxx11::string::~string((string *)&int_value);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&err + 3));
        this_local._7_1_ = 0;
        local_394 = 1;
      }
      else {
        ::std::__cxx11::stringstream::str();
        iVar2 = anon_unknown_3::parseInt(&local_4e8,&local_4c0);
        ::std::__cxx11::string::~string((string *)&local_4e8);
        local_4c4 = iVar2;
        if (iVar2 == 0) {
          *local_20 = local_4c0;
          this_local._7_1_ = 1;
          local_394 = 1;
        }
        else if (iVar2 == -1) {
          ::std::__cxx11::stringstream::str();
          ::std::operator+((char *)local_528,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Invalid integer input: `");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_508,(char *)local_528);
          PushError(this,&local_508);
          ::std::__cxx11::string::~string((string *)&local_508);
          ::std::__cxx11::string::~string(local_528);
          ::std::__cxx11::string::~string(local_548);
          this_local._7_1_ = 0;
          local_394 = 1;
        }
        else if (iVar2 == -2) {
          ::std::__cxx11::stringstream::str();
          ::std::operator+((char *)local_588,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Integer overflows: `");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_568,(char *)local_588);
          PushError(this,&local_568);
          ::std::__cxx11::string::~string((string *)&local_568);
          ::std::__cxx11::string::~string(local_588);
          ::std::__cxx11::string::~string(local_5a8);
          this_local._7_1_ = 0;
          local_394 = 1;
        }
        else if (iVar2 == -3) {
          ::std::__cxx11::stringstream::str();
          ::std::operator+((char *)local_5e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Integer underflows: `");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_5c8,(char *)local_5e8);
          PushError(this,&local_5c8);
          ::std::__cxx11::string::~string((string *)&local_5c8);
          ::std::__cxx11::string::~string(local_5e8);
          ::std::__cxx11::string::~string(local_608);
          this_local._7_1_ = 0;
          local_394 = 1;
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_628,"Unknown parseInt error.\n",&local_629);
          PushError(this,&local_628);
          ::std::__cxx11::string::~string((string *)&local_628);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_629);
          this_local._7_1_ = 0;
          local_394 = 1;
        }
      }
    }
  }
  else {
    this_local._7_1_ = 0;
    local_394 = 1;
  }
LAB_0053bcc2:
  ::std::__cxx11::string::~string
            ((string *)
             &flt.contained.
              super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&loc);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ReadBasicType(int *value) {
  std::stringstream ss;

  // pxrUSD allow floating-point value to `int` type.
  // so first try fp parsing.
  auto loc = CurrLoc();
  std::string fp_str;
  if (LexFloat(&fp_str)) {
    auto flt = ParseDouble(fp_str);
    if (!flt) {
      PUSH_ERROR_AND_RETURN("Failed to parse floating value.");
    } else {
      (*value) = int(flt.value());
      return true;
    }
  }

  // revert
  SeekTo(loc);

  // head character
  bool has_sign = false;
  // bool negative = false;
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign or [0-9]
    if (sc == '+') {
      // negative = false;
      has_sign = true;
    } else if (sc == '-') {
      // negative = true;
      has_sign = true;
    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
    } else {
      PushError("Sign or 0-9 expected, but got '" + std::to_string(sc) +
                "'.\n");
      return false;
    }

    ss << sc;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if ((c >= '0') && (c <= '9')) {
      ss << c;
    } else {
      _sr->seek_from_current(-1);
      break;
    }
  }

  if (has_sign && (ss.str().size() == 1)) {
    // sign only
    PushError("Integer value expected but got sign character only.\n");
    return false;
  }

  if ((ss.str().size() > 1) && (ss.str()[0] == '0')) {
    PushError("Zero padded integer value is not allowed.\n");
    return false;
  }

  // std::cout << "ReadInt token: " << ss.str() << "\n";

  int int_value;
  int err = parseInt(ss.str(), &int_value);
  if (err != 0) {
    if (err == -1) {
      PushError("Invalid integer input: `" + ss.str() + "`\n");
      return false;
    } else if (err == -2) {
      PushError("Integer overflows: `" + ss.str() + "`\n");
      return false;
    } else if (err == -3) {
      PushError("Integer underflows: `" + ss.str() + "`\n");
      return false;
    } else {
      PushError("Unknown parseInt error.\n");
      return false;
    }
  }

  (*value) = int_value;

  return true;
}